

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O0

int compare_update_operations(void *a,void *b)

{
  long in_FS_OFFSET;
  aspa_update_operation *op2;
  aspa_update_operation *op1;
  void *b_local;
  void *a_local;
  
  if (*(uint *)((long)a + 0x10) < *(uint *)((long)b + 0x10)) {
    a_local._4_4_ = -1;
  }
  else if (*(uint *)((long)b + 0x10) < *(uint *)((long)a + 0x10)) {
    a_local._4_4_ = 1;
  }
  else if (*b < *a) {
    a_local._4_4_ = 1;
  }
  else if (*a < *b) {
    a_local._4_4_ = -1;
  }
  else {
    a_local._4_4_ = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return a_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

static int compare_update_operations(const void *a, const void *b)
{
	const struct aspa_update_operation *op1 = a;
	const struct aspa_update_operation *op2 = b;

	// compare index in case customer ASNs match, so result is stable
	if (op1->record.customer_asn < op2->record.customer_asn)
		return -1;
	else if (op1->record.customer_asn > op2->record.customer_asn)
		return 1;
	else if (op1->index > op2->index)
		return 1;
	else if (op1->index < op2->index)
		return -1;
	else
		return 0;
}